

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * Path::enforce_protocol(string *__return_storage_ptr__,string *path)

{
  long lVar1;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (path->_M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_38);
  }
  else {
    lVar1 = std::__cxx11::string::find((char *)path,0x14ed93);
    if (lVar1 == -1) {
      std::__cxx11::string::string((string *)&local_38,"file://",&local_39);
      std::operator+(__return_storage_ptr__,&local_38,path);
      std::__cxx11::string::_M_dispose();
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string enforce_protocol(const string &path)
{
	if (path.empty())
		return "";

	auto index = path.find("://");
	if (index == string::npos)
		return string("file://") + path;
	else
		return path;
}